

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

bool __thiscall
glcts::TextureCubeMapArraySamplingTest::verifyResultHelper
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          resolutionDefinition *resolution,componentProvider *component_provider,uchar *data)

{
  byte bVar1;
  bool bVar2;
  GLenum GVar3;
  GLenum GVar4;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *getComponents;
  uint n_mipmap_levels;
  uint n_layers;
  
  bVar1 = getMipmapLevelCount(resolution->m_width,resolution->m_height);
  n_mipmap_levels = (uint)bVar1;
  bVar2 = false;
  n_layers = resolution->m_depth / 6;
  GVar4 = (format->m_source).m_format;
  if (GVar4 == 0x8d99) {
    GVar4 = (format->m_source).m_type;
    if (GVar4 == 0x1404) {
      bVar2 = verifyResultImage<int,4u,3u,3u>
                        (n_mipmap_levels,n_layers,
                         (_func_void_GLuint_GLint_GLint_GLint_GLint_int_ptr *)
                         component_provider->getColorIntComponents,data);
      goto LAB_00d42602;
    }
    if (GVar4 == 0x1405) {
      bVar2 = verifyResultImage<unsigned_int,4u,3u,3u>
                        (n_mipmap_levels,n_layers,
                         (_func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *)
                         component_provider->getColorUintComponents,data);
      goto LAB_00d42602;
    }
LAB_00d425c6:
    bVar2 = false;
  }
  else {
    if (GVar4 != 0x1908) goto LAB_00d42602;
    GVar4 = (format->m_source).m_type;
    if (GVar4 == 0x9278) {
      getComponents = component_provider->getCompressedComponents;
    }
    else {
      if (GVar4 == 0x1406) {
        bVar2 = verifyResultImage<float,4u,3u,3u>
                          (n_mipmap_levels,n_layers,
                           (_func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *)
                           component_provider->getColorFloatComponents,data);
        goto LAB_00d42602;
      }
      if (GVar4 != 0x1401) goto LAB_00d425c6;
      getComponents = component_provider->getColorUByteComponents;
    }
    bVar2 = verifyResultImage<unsigned_char,4u,3u,3u>
                      (n_mipmap_levels,n_layers,
                       (_func_void_GLuint_GLint_GLint_GLint_GLint_uchar_ptr *)getComponents,data);
  }
LAB_00d42602:
  GVar4 = (format->m_source).m_format;
  GVar3 = (format->m_source).m_type;
  if (GVar3 == 0x1406 && GVar4 == 0x1902) {
    bVar2 = verifyResultImage<float,1u,3u,3u>
                      (n_mipmap_levels,n_layers,
                       (_func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *)
                       component_provider->getDepthComponents,data);
    GVar4 = (format->m_source).m_format;
    GVar3 = (format->m_source).m_type;
  }
  if ((GVar4 == 0x1901) && (GVar3 == 0x1401)) {
    bVar2 = verifyResultImage<unsigned_int,1u,3u,3u>
                      (n_mipmap_levels,n_layers,
                       (_func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *)
                       component_provider->getStencilComponents,data);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool TextureCubeMapArraySamplingTest::verifyResultHelper(const formatDefinition&	 format,
														 const resolutionDefinition& resolution,
														 const componentProvider&	component_provider,
														 unsigned char*				 data)
{
	const glw::GLuint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	const glw::GLuint n_layers		  = resolution.m_depth / 6;

	bool result = false;

	if (GL_RGBA == format.m_source.m_format)
	{
		if (GL_UNSIGNED_BYTE == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLubyte, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getColorUByteComponents, data);
		}
		else if (GL_FLOAT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLfloat, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getColorFloatComponents, data);
		}
		else if (GL_COMPRESSED_RGBA8_ETC2_EAC == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLubyte, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getCompressedComponents, data);
		}
	}
	else if (GL_RGBA_INTEGER == format.m_source.m_format)
	{
		if (GL_UNSIGNED_INT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLuint, 4, 3, 3>(n_mipmap_levels, n_layers,
															 component_provider.getColorUintComponents, data);
		}
		else if (GL_INT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLint, 4, 3, 3>(n_mipmap_levels, n_layers,
															component_provider.getColorIntComponents, data);
		}
	}
	if (GL_DEPTH_COMPONENT == format.m_source.m_format)
	{
		if (GL_FLOAT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLfloat, 1, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getDepthComponents, data);
		}
	}
	if (GL_STENCIL_INDEX == format.m_source.m_format)
	{
		if (GL_UNSIGNED_BYTE == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLuint, 1, 3, 3>(n_mipmap_levels, n_layers,
															 component_provider.getStencilComponents, data);
		}
	}

	return result;
}